

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::DecimalQuantity::_setToDoubleFast(DecimalQuantity *this,double n)

{
  uint uVar1;
  double *pdVar2;
  uint uVar3;
  double dVar4;
  
  this->isApproximate = '\x01';
  this->origDouble = n;
  this->origDelta = 0;
  uVar1 = (uint)((ulong)n >> 0x34) & 0x7ff;
  if (uVar1 < 0x434) {
    dVar4 = (double)(long)n;
    if ((dVar4 == n) && (!NAN(dVar4) && !NAN(n))) {
      _setToLong(this,(long)n);
      return;
    }
  }
  uVar3 = (uint)((double)(int)(0x433 - uVar1) / 3.32192809489);
  uVar1 = uVar3;
  if ((int)uVar3 < 0) {
    for (; (int)uVar1 < -0x15; uVar1 = uVar1 + 0x16) {
      n = n / 1e+22;
    }
    dVar4 = n / *(double *)(::(anonymous_namespace)::DOUBLE_MULTIPLIERS + (ulong)-uVar1 * 8);
  }
  else {
    pdVar2 = (double *)(::(anonymous_namespace)::DOUBLE_MULTIPLIERS + (ulong)uVar3 * 8);
    for (; 0x15 < (int)uVar1; uVar1 = uVar1 - 0x16) {
      n = n * 1e+22;
      pdVar2 = pdVar2 + -0x16;
    }
    dVar4 = n * *pdVar2;
  }
  dVar4 = round(dVar4);
  if ((long)dVar4 != 0) {
    _setToLong(this,(long)dVar4);
    this->scale = this->scale - uVar3;
  }
  return;
}

Assistant:

void DecimalQuantity::_setToDoubleFast(double n) {
    isApproximate = true;
    origDouble = n;
    origDelta = 0;

    // Make sure the double is an IEEE 754 double.  If not, fall back to the slow path right now.
    // TODO: Make a fast path for other types of doubles.
    if (!std::numeric_limits<double>::is_iec559) {
        convertToAccurateDouble();
        // Turn off the approximate double flag, since the value is now exact.
        isApproximate = false;
        origDouble = 0.0;
        return;
    }

    // To get the bits from the double, use memcpy, which takes care of endianness.
    uint64_t ieeeBits;
    uprv_memcpy(&ieeeBits, &n, sizeof(n));
    int32_t exponent = static_cast<int32_t>((ieeeBits & 0x7ff0000000000000L) >> 52) - 0x3ff;

    // Not all integers can be represented exactly for exponent > 52
    if (exponent <= 52 && static_cast<int64_t>(n) == n) {
        _setToLong(static_cast<int64_t>(n));
        return;
    }

    // 3.3219... is log2(10)
    auto fracLength = static_cast<int32_t> ((52 - exponent) / 3.32192809489);
    if (fracLength >= 0) {
        int32_t i = fracLength;
        // 1e22 is the largest exact double.
        for (; i >= 22; i -= 22) n *= 1e22;
        n *= DOUBLE_MULTIPLIERS[i];
    } else {
        int32_t i = fracLength;
        // 1e22 is the largest exact double.
        for (; i <= -22; i += 22) n /= 1e22;
        n /= DOUBLE_MULTIPLIERS[-i];
    }
    auto result = static_cast<int64_t>(std::round(n));
    if (result != 0) {
        _setToLong(result);
        scale -= fracLength;
    }
}